

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id,_Bool clear_settings_refs)

{
  ImGuiID IVar1;
  ImGuiWindow_conflict *window_00;
  ImGuiContext_conflict *ctx_00;
  ImGuiDockNode *pIVar2;
  ImGuiWindow_conflict **ppIVar3;
  bool bVar4;
  ImGuiID backup_dock_id;
  _Bool want_removal_1;
  ImGuiWindow_conflict *window;
  int n;
  ImGuiDockNode *node;
  ImGuiWindowSettings *pIStack_28;
  _Bool want_removal;
  ImGuiWindowSettings *settings;
  ImGuiContext_conflict *g;
  ImGuiContext_conflict *ctx;
  _Bool clear_settings_refs_local;
  ImGuiID root_id_local;
  
  ctx_00 = GImGui;
  if (clear_settings_refs) {
    for (pIStack_28 = ImChunkStream<ImGuiWindowSettings>::begin(&GImGui->SettingsWindows);
        pIStack_28 != (ImGuiWindowSettings *)0x0;
        pIStack_28 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                               (&ctx_00->SettingsWindows,pIStack_28)) {
      bVar4 = true;
      if (root_id != 0) {
        bVar4 = pIStack_28->DockId == root_id;
      }
      if ((((!bVar4) && (pIStack_28->DockId != 0)) &&
          (pIVar2 = DockContextFindNodeByID(ctx_00,pIStack_28->DockId),
          pIVar2 != (ImGuiDockNode *)0x0)) &&
         (pIVar2 = DockNodeGetRootNode(pIVar2), pIVar2->ID == root_id)) {
        bVar4 = true;
      }
      if (bVar4) {
        pIStack_28->DockId = 0;
      }
    }
  }
  window._4_4_ = 0;
  do {
    if ((ctx_00->Windows).Size <= window._4_4_) {
      return;
    }
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&ctx_00->Windows,window._4_4_);
    window_00 = *ppIVar3;
    bVar4 = true;
    if (root_id != 0) {
      if (window_00->DockNode != (ImGuiDockNode *)0x0) {
        pIVar2 = DockNodeGetRootNode(window_00->DockNode);
        bVar4 = true;
        if (pIVar2->ID == root_id) goto LAB_0026e1df;
      }
      bVar4 = false;
      if (window_00->DockNodeAsHost != (ImGuiDockNode *)0x0) {
        bVar4 = window_00->DockNodeAsHost->ID == root_id;
      }
    }
LAB_0026e1df:
    if (bVar4) {
      IVar1 = window_00->DockId;
      DockContextProcessUndockWindow(ctx_00,window_00,clear_settings_refs);
      if ((!clear_settings_refs) && (window_00->DockId != IVar1)) {
        __assert_fail("window->DockId == backup_dock_id",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x3d40,"void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID, bool)");
      }
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeDockedWindows(ImGuiID root_id, bool clear_settings_refs)
{
    // Clear references in settings
    ImGuiContext* ctx = GImGui;
    ImGuiContext& g = *ctx;
    if (clear_settings_refs)
    {
        for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        {
            bool want_removal = (root_id == 0) || (settings->DockId == root_id);
            if (!want_removal && settings->DockId != 0)
                if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, settings->DockId))
                    if (DockNodeGetRootNode(node)->ID == root_id)
                        want_removal = true;
            if (want_removal)
                settings->DockId = 0;
        }
    }

    // Clear references in windows
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window = g.Windows[n];
        bool want_removal = (root_id == 0) || (window->DockNode && DockNodeGetRootNode(window->DockNode)->ID == root_id) || (window->DockNodeAsHost && window->DockNodeAsHost->ID == root_id);
        if (want_removal)
        {
            const ImGuiID backup_dock_id = window->DockId;
            IM_UNUSED(backup_dock_id);
            DockContextProcessUndockWindow(ctx, window, clear_settings_refs);
            if (!clear_settings_refs)
                IM_ASSERT(window->DockId == backup_dock_id);
        }
    }
}